

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

lazy_trace_holder * __thiscall
cpptrace::detail::lazy_trace_holder::operator=(lazy_trace_holder *this,lazy_trace_holder *other)

{
  bool bVar1;
  
  clear(this);
  bVar1 = other->resolved;
  this->resolved = bVar1;
  if (bVar1 == true) {
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::vector
              ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
               &(this->field_1).trace,
               (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
               &(other->field_1).trace);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&(this->field_1).trace.frames,&(other->field_1).trace.frames);
  }
  return this;
}

Assistant:

lazy_trace_holder& lazy_trace_holder::operator=(const lazy_trace_holder& other) {
            clear();
            resolved = other.resolved;
            if(other.resolved) {
                new (&resolved_trace) stacktrace(other.resolved_trace);
            } else {
                new (&trace) raw_trace(other.trace);
            }
            return *this;
        }